

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O1

Box * OutFlowBC::SemiCoarsen(Box *__return_storage_ptr__,Box *baseBox,int ref_factor,int direction)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int dir;
  long lVar10;
  IntVect ref_ratio;
  int local_c [3];
  
  ref_ratio.vect[0] = ref_factor;
  ref_ratio.vect[1] = ref_factor;
  ref_ratio.vect[2] = ref_factor;
  ref_ratio.vect[direction] = 1;
  uVar1 = *(undefined8 *)(baseBox->smallend).vect;
  uVar2 = *(undefined8 *)((baseBox->smallend).vect + 2);
  uVar3 = *(undefined8 *)((baseBox->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(baseBox->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar1;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar2;
  if (((ref_ratio.vect[0] == 1) && (ref_ratio.vect[1] == 1)) && (ref_ratio.vect[2] == 1)) {
    return __return_storage_ptr__;
  }
  uVar4 = (__return_storage_ptr__->smallend).vect[0];
  if (ref_ratio.vect[0] != 1) {
    if (ref_ratio.vect[0] == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 2;
LAB_0033abdc:
        uVar4 = ~uVar7;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio.vect[0] == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 1;
        goto LAB_0033abdc;
      }
      uVar4 = uVar4 >> 1;
    }
    else if ((int)uVar4 < 0) {
      iVar6 = uVar4 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar4 = ~(iVar5 / ref_ratio.vect[0]);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio.vect[0];
    }
  }
  (__return_storage_ptr__->smallend).vect[0] = uVar4;
  uVar4 = (__return_storage_ptr__->smallend).vect[1];
  if (ref_ratio.vect[1] != 1) {
    if (ref_ratio.vect[1] == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 2;
LAB_0033ac3d:
        uVar4 = ~uVar7;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio.vect[1] == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 1;
        goto LAB_0033ac3d;
      }
      uVar4 = uVar4 >> 1;
    }
    else if ((int)uVar4 < 0) {
      iVar6 = uVar4 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar4 = ~(iVar5 / ref_ratio.vect[1]);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio.vect[1];
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar4;
  uVar4 = (__return_storage_ptr__->smallend).vect[2];
  if (ref_ratio.vect[2] != 1) {
    if (ref_ratio.vect[2] == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 2;
LAB_0033aca5:
        uVar4 = ~uVar7;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio.vect[2] == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar7 = -uVar4;
        if (0 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 >> 1;
        goto LAB_0033aca5;
      }
      uVar4 = uVar4 >> 1;
    }
    else if ((int)uVar4 < 0) {
      iVar6 = uVar4 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar4 = ~(iVar5 / ref_ratio.vect[2]);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio.vect[2];
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar4;
  uVar4 = (__return_storage_ptr__->btype).itype;
  if (uVar4 == 0) {
    uVar4 = (__return_storage_ptr__->bigend).vect[0];
    if (ref_ratio.vect[0] != 1) {
      if (ref_ratio.vect[0] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 + 1;
          uVar7 = -uVar4;
          if (0 < (int)uVar4) {
            uVar7 = uVar4;
          }
          uVar7 = uVar7 >> 2;
LAB_0033aea7:
          uVar4 = ~uVar7;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[0] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 + 1;
          uVar7 = -uVar4;
          if (0 < (int)uVar4) {
            uVar7 = uVar4;
          }
          uVar7 = uVar7 >> 1;
          goto LAB_0033aea7;
        }
        uVar4 = uVar4 >> 1;
      }
      else if ((int)uVar4 < 0) {
        iVar6 = uVar4 + 1;
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        uVar4 = ~(iVar5 / ref_ratio.vect[0]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[0];
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar4;
    uVar4 = (__return_storage_ptr__->bigend).vect[1];
    if (ref_ratio.vect[1] != 1) {
      if (ref_ratio.vect[1] == 4) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 + 1;
          uVar7 = -uVar4;
          if (0 < (int)uVar4) {
            uVar7 = uVar4;
          }
          uVar7 = uVar7 >> 2;
LAB_0033af09:
          uVar4 = ~uVar7;
        }
        else {
          uVar4 = uVar4 >> 2;
        }
      }
      else if (ref_ratio.vect[1] == 2) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 + 1;
          uVar7 = -uVar4;
          if (0 < (int)uVar4) {
            uVar7 = uVar4;
          }
          uVar7 = uVar7 >> 1;
          goto LAB_0033af09;
        }
        uVar4 = uVar4 >> 1;
      }
      else if ((int)uVar4 < 0) {
        iVar6 = uVar4 + 1;
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        uVar4 = ~(iVar5 / ref_ratio.vect[1]);
      }
      else {
        uVar4 = (int)uVar4 / ref_ratio.vect[1];
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar4;
    uVar4 = (__return_storage_ptr__->bigend).vect[2];
    if (ref_ratio.vect[2] == 1) goto LAB_0033ae87;
    if (ref_ratio.vect[2] == 4) {
      if (-1 < (int)uVar4) {
        uVar4 = uVar4 >> 2;
        goto LAB_0033ae87;
      }
      uVar4 = uVar4 + 1;
      uVar7 = -uVar4;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
      uVar7 = uVar7 >> 2;
    }
    else {
      if (ref_ratio.vect[2] != 2) {
        if ((int)uVar4 < 0) {
          iVar6 = uVar4 + 1;
          iVar5 = -iVar6;
          if (0 < iVar6) {
            iVar5 = iVar6;
          }
          uVar4 = ~(iVar5 / ref_ratio.vect[2]);
        }
        else {
          uVar4 = (int)uVar4 / ref_ratio.vect[2];
        }
        goto LAB_0033ae87;
      }
      if (-1 < (int)uVar4) {
        uVar4 = uVar4 >> 1;
        goto LAB_0033ae87;
      }
      uVar4 = uVar4 + 1;
      uVar7 = -uVar4;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
      uVar7 = uVar7 >> 1;
    }
    uVar4 = ~uVar7;
    goto LAB_0033ae87;
  }
  local_c[0] = 0;
  local_c[1] = 0;
  local_c[2] = 0;
  lVar10 = 0;
  do {
    if (((uVar4 >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
       ((__return_storage_ptr__->bigend).vect[lVar10] % ref_ratio.vect[lVar10] != 0)) {
      local_c[lVar10] = 1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  uVar7 = (__return_storage_ptr__->bigend).vect[0];
  if (ref_ratio.vect[0] != 1) {
    if (ref_ratio.vect[0] == 4) {
      if ((int)uVar7 < 0) {
        uVar7 = uVar7 + 1;
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        uVar4 = uVar4 >> 2;
LAB_0033ad94:
        uVar7 = ~uVar4;
      }
      else {
        uVar7 = uVar7 >> 2;
      }
    }
    else if (ref_ratio.vect[0] == 2) {
      if ((int)uVar7 < 0) {
        uVar7 = uVar7 + 1;
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        uVar4 = uVar4 >> 1;
        goto LAB_0033ad94;
      }
      uVar7 = uVar7 >> 1;
    }
    else if ((int)uVar7 < 0) {
      iVar6 = uVar7 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar7 = ~(iVar5 / ref_ratio.vect[0]);
    }
    else {
      uVar7 = (int)uVar7 / ref_ratio.vect[0];
    }
  }
  (__return_storage_ptr__->bigend).vect[0] = uVar7;
  uVar9 = (__return_storage_ptr__->bigend).vect[1];
  if (ref_ratio.vect[1] != 1) {
    if (ref_ratio.vect[1] == 4) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar4 = -uVar9;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        uVar4 = uVar4 >> 2;
LAB_0033adf8:
        uVar9 = ~uVar4;
      }
      else {
        uVar9 = uVar9 >> 2;
      }
    }
    else if (ref_ratio.vect[1] == 2) {
      if ((int)uVar9 < 0) {
        uVar9 = uVar9 + 1;
        uVar4 = -uVar9;
        if (0 < (int)uVar9) {
          uVar4 = uVar9;
        }
        uVar4 = uVar4 >> 1;
        goto LAB_0033adf8;
      }
      uVar9 = uVar9 >> 1;
    }
    else if ((int)uVar9 < 0) {
      iVar6 = uVar9 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar9 = ~(iVar5 / ref_ratio.vect[1]);
    }
    else {
      uVar9 = (int)uVar9 / ref_ratio.vect[1];
    }
  }
  (__return_storage_ptr__->bigend).vect[1] = uVar9;
  uVar4 = (__return_storage_ptr__->bigend).vect[2];
  if (ref_ratio.vect[2] != 1) {
    if (ref_ratio.vect[2] == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        uVar8 = uVar8 >> 2;
LAB_0033ae5b:
        uVar4 = ~uVar8;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio.vect[2] == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        uVar8 = uVar8 >> 1;
        goto LAB_0033ae5b;
      }
      uVar4 = uVar4 >> 1;
    }
    else if ((int)uVar4 < 0) {
      iVar6 = uVar4 + 1;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar4 = ~(iVar5 / ref_ratio.vect[2]);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio.vect[2];
    }
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar4;
  (__return_storage_ptr__->bigend).vect[0] = uVar7 + local_c[0];
  (__return_storage_ptr__->bigend).vect[1] = uVar9 + local_c[1];
  uVar4 = uVar4 + local_c[2];
LAB_0033ae87:
  (__return_storage_ptr__->bigend).vect[2] = uVar4;
  return __return_storage_ptr__;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    constexpr IntVect (AMREX_D_DECL(int i, int j, int k)) noexcept : vect{AMREX_D_DECL(i,j,k)} {}